

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  ulong uVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = lodepng_chunk_type_name_valid(chunk);
  if (uVar2 == '\0') {
    uVar3 = 0x79;
  }
  else if ((chunk[6] & 0x20) == 0) {
    uVar3 = lodepng_read32bitInt(chunk);
    uVar7 = (ulong)uVar3 + 0xc;
    uVar1 = *outsize;
    if (CARRY8(uVar7,uVar1)) {
      uVar3 = 0x4d;
    }
    else {
      puVar4 = (uchar *)realloc(*out,uVar7 + uVar1);
      if (puVar4 == (uchar *)0x0) {
        uVar3 = 0x53;
      }
      else {
        *out = puVar4;
        *outsize = uVar7 + uVar1;
        uVar3 = 0;
        for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar7 != uVar6; uVar5 = uVar5 + 1) {
          puVar4[uVar6 + uVar1] = chunk[uVar6];
        }
      }
    }
  }
  else {
    uVar3 = 0x7a;
  }
  return uVar3;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char *chunk_start, *new_buffer;

  if(!lodepng_chunk_type_name_valid(chunk)) {
    return 121; /* invalid chunk type name */
  }
  if(lodepng_chunk_reserved(chunk)) {
    return 122; /* invalid third lowercase character */
  }

  if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if(lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}